

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format-inl.h
# Opt level: O3

result __thiscall
fmt::v7::detail::fixed_handler::on_digit
          (fixed_handler *this,char digit,uint64_t divisor,uint64_t remainder,uint64_t error,
          int param_5,bool integral)

{
  int iVar1;
  ulong uVar2;
  
  if (divisor <= remainder) {
    assert_fail("/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/src/include/fmt/format-inl.h"
                ,0x64f,"");
  }
  iVar1 = this->size;
  this->size = iVar1 + 1;
  this->buf[iVar1] = digit;
  if (error < remainder || integral) {
    if (this->size < this->precision) {
      return more;
    }
    if (integral) {
      if ((divisor < 3) || (error != 1)) {
        assert_fail("/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/src/include/fmt/format-inl.h"
                    ,0x659,"");
      }
    }
    else if (divisor <= error || divisor - error <= error) {
      return error;
    }
    if (divisor <= error) {
      assert_fail("/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/src/include/fmt/format-inl.h"
                  ,0x5cc,"");
    }
    if (divisor - error <= error) {
      assert_fail("/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/src/include/fmt/format-inl.h"
                  ,0x5cd,"");
    }
    if ((remainder <= divisor - remainder) && (error * 2 <= divisor + remainder * -2)) {
      return done;
    }
    if (error <= remainder) {
      if (remainder - error < divisor - (remainder - error)) {
        return error;
      }
      this->buf[(long)this->size + -1] = this->buf[(long)this->size + -1] + '\x01';
      if (1 < (long)this->size) {
        uVar2 = (long)this->size + 1;
        do {
          if (this->buf[uVar2 - 2] < ':') break;
          this->buf[uVar2 - 2] = '0';
          this->buf[uVar2 - 3] = this->buf[uVar2 - 3] + '\x01';
          uVar2 = uVar2 - 1;
        } while (2 < uVar2);
      }
      if (*this->buf < ':') {
        return done;
      }
      *this->buf = '1';
      if (this->fixed != true) {
        this->exp10 = this->exp10 + 1;
        return done;
      }
      iVar1 = this->size;
      this->size = iVar1 + 1;
      this->buf[iVar1] = '0';
      return done;
    }
  }
  return error;
}

Assistant:

digits::result on_digit(char digit, uint64_t divisor, uint64_t remainder,
                          uint64_t error, int, bool integral) {
    FMT_ASSERT(remainder < divisor, "");
    buf[size++] = digit;
    if (!integral && error >= remainder) return digits::error;
    if (size < precision) return digits::more;
    if (!integral) {
      // Check if error * 2 < divisor with overflow prevention.
      // The check is not needed for the integral part because error = 1
      // and divisor > (1 << 32) there.
      if (error >= divisor || error >= divisor - error) return digits::error;
    } else {
      FMT_ASSERT(error == 1 && divisor > 2, "");
    }
    auto dir = get_round_direction(divisor, remainder, error);
    if (dir != round_direction::up)
      return dir == round_direction::down ? digits::done : digits::error;
    ++buf[size - 1];
    for (int i = size - 1; i > 0 && buf[i] > '9'; --i) {
      buf[i] = '0';
      ++buf[i - 1];
    }
    if (buf[0] > '9') {
      buf[0] = '1';
      if (fixed)
        buf[size++] = '0';
      else
        ++exp10;
    }
    return digits::done;
  }